

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

void __thiscall gfield::reduce<26>(gfield *this,bigint<26> *result)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  undefined1 local_38 [8];
  gfield s;
  bigint<26> *result_local;
  gfield *this_local;
  
  s.super_gfint._24_8_ = result;
  iVar2 = min<int>(result->len,0xc);
  (this->super_gfint).len = iVar2;
  memcpy((this->super_gfint).digits,(void *)(s.super_gfint._24_8_ + 4),
         (long)(this->super_gfint).len << 1);
  bigint<13>::shrink(&this->super_gfint);
  if (*(int *)s.super_gfint._24_8_ < 0xd) {
    bVar1 = bigint<13>::operator>=(&this->super_gfint,&P.super_gfint);
    if (bVar1) {
      bigint<13>::sub<13,13>(&this->super_gfint,&this->super_gfint,&P.super_gfint);
    }
  }
  else {
    gfield((gfield *)local_38);
    pvVar3 = (void *)(s.super_gfint._24_8_ + 0x1c);
    iVar2 = min<int>(*(int *)s.super_gfint._24_8_ + -0xc,4);
    memcpy(local_38 + 4,pvVar3,(long)iVar2 << 1);
    if (*(int *)s.super_gfint._24_8_ < 0x10) {
      memset(s.super_gfint.digits + (long)(*(int *)s.super_gfint._24_8_ + -0xc) + -4,0,
             (long)(0x10 - *(int *)s.super_gfint._24_8_) << 1);
    }
    s.super_gfint.digits[0] = local_38._4_2_;
    s.super_gfint.digits[1] = local_38._6_2_;
    s.super_gfint.digits[2] = (digit)s.super_gfint.len;
    s.super_gfint.digits[3] = s.super_gfint.len._2_2_;
    local_38._0_4_ = 8;
    bigint<13>::shrink((bigint<13> *)local_38);
    add<13>(this,(bigint<13> *)local_38);
    if (0x10 < *(int *)s.super_gfint._24_8_) {
      memset(local_38 + 4,0,8);
      pvVar3 = (void *)(s.super_gfint._24_8_ + 0x24);
      iVar2 = min<int>(*(int *)s.super_gfint._24_8_ + -0x10,4);
      memcpy(s.super_gfint.digits,pvVar3,(long)iVar2 << 1);
      if (*(int *)s.super_gfint._24_8_ < 0x14) {
        memset(s.super_gfint.digits + (long)(*(int *)s.super_gfint._24_8_ + -0xc) + -4,0,
               (long)(0x14 - *(int *)s.super_gfint._24_8_) << 1);
      }
      s.super_gfint.digits[4] = s.super_gfint.digits[0];
      s.super_gfint.digits[5] = s.super_gfint.digits[1];
      s.super_gfint.digits[6] = s.super_gfint.digits[2];
      s.super_gfint.digits[7] = s.super_gfint.digits[3];
      local_38._0_4_ = 0xc;
      bigint<13>::shrink((bigint<13> *)local_38);
      add<13>(this,(bigint<13> *)local_38);
      if (0x14 < *(int *)s.super_gfint._24_8_) {
        pvVar3 = (void *)(s.super_gfint._24_8_ + 0x2c);
        iVar2 = min<int>(*(int *)s.super_gfint._24_8_ + -0x14,4);
        memcpy(local_38 + 4,pvVar3,(long)iVar2 << 1);
        if (*(int *)s.super_gfint._24_8_ < 0x18) {
          memset(s.super_gfint.digits + (long)(*(int *)s.super_gfint._24_8_ + -0x14) + -4,0,
                 (long)(0x18 - *(int *)s.super_gfint._24_8_) << 1);
        }
        s.super_gfint.digits[0] = local_38._4_2_;
        s.super_gfint.digits[1] = local_38._6_2_;
        s.super_gfint.digits[2] = (digit)s.super_gfint.len;
        s.super_gfint.digits[3] = s.super_gfint.len._2_2_;
        s.super_gfint.digits[4] = local_38._4_2_;
        s.super_gfint.digits[5] = local_38._6_2_;
        s.super_gfint.digits[6] = (digit)s.super_gfint.len;
        s.super_gfint.digits[7] = s.super_gfint.len._2_2_;
        local_38._0_4_ = 0xc;
        bigint<13>::shrink((bigint<13> *)local_38);
        add<13>(this,(bigint<13> *)local_38);
      }
    }
  }
  return;
}

Assistant:

void reduce(const bigint<RESULT_DIGITS> &result)
    {
#if GF_BITS==192
        len = min(result.len, GF_DIGITS);
        memcpy(digits, result.digits, len*sizeof(digit));
        shrink();

        if(result.len > 192/BI_DIGIT_BITS)
        {
            gfield s;
            memcpy(s.digits, &result.digits[192/BI_DIGIT_BITS], min(result.len-192/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
            if(result.len < 256/BI_DIGIT_BITS) memset(&s.digits[result.len-192/BI_DIGIT_BITS], 0, (256/BI_DIGIT_BITS-result.len)*sizeof(digit));
            memcpy(&s.digits[64/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
            s.len = 128/BI_DIGIT_BITS;
            s.shrink();
            add(s);

            if(result.len > 256/BI_DIGIT_BITS)
            {
                memset(s.digits, 0, 64/BI_DIGIT_BITS*sizeof(digit));
                memcpy(&s.digits[64/BI_DIGIT_BITS], &result.digits[256/BI_DIGIT_BITS], min(result.len-256/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
                if(result.len < 320/BI_DIGIT_BITS) memset(&s.digits[result.len+(64-256)/BI_DIGIT_BITS], 0, (320/BI_DIGIT_BITS-result.len)*sizeof(digit));
                memcpy(&s.digits[128/BI_DIGIT_BITS], &s.digits[64/BI_DIGIT_BITS], 64/BI_DIGIT_BITS*sizeof(digit));
                s.len = GF_DIGITS;
                s.shrink();
                add(s);

                if(result.len > 320/BI_DIGIT_BITS)
                {
                    memcpy(s.digits, &result.digits[320/BI_DIGIT_BITS], min(result.len-320/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
                    if(result.len < 384/BI_DIGIT_BITS) memset(&s.digits[result.len-320/BI_DIGIT_BITS], 0, (384/BI_DIGIT_BITS-result.len)*sizeof(digit));
                    memcpy(&s.digits[64/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
                    memcpy(&s.digits[128/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
                    s.len = GF_DIGITS;
                    s.shrink();
                    add(s);
                }
            }
        }
        else if(*this >= P) gfint::sub(*this, P);
#else
#error Unsupported GF
#endif
    }